

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  FieldDescriptor *descriptor_00;
  bool bVar1;
  Type TVar2;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  LogMessage *other;
  Descriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  char *__s;
  LogFinisher local_59;
  string wrapped_field_type_name;
  
  TVar2 = FieldDescriptor::type(descriptor);
  switch(TVar2) {
  case TYPE_DOUBLE:
    __s = "double";
    break;
  case TYPE_FLOAT:
    __s = "float";
    break;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    __s = "long";
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    __s = "ulong";
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    __s = "int";
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    __s = "uint";
    break;
  case TYPE_BOOL:
    __s = "bool";
    break;
  case TYPE_STRING:
    __s = "string";
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar1 = IsWrapperType(descriptor);
    this_00 = FieldDescriptor::message_type(descriptor);
    if (bVar1) {
      descriptor_00 = *(FieldDescriptor **)(this_00 + 0x30);
      type_name_abi_cxx11_(&wrapped_field_type_name,this,descriptor_00);
      TVar2 = FieldDescriptor::type(descriptor_00);
      if ((TVar2 == TYPE_STRING) ||
         (TVar2 = FieldDescriptor::type(descriptor_00), TVar2 == TYPE_BYTES)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)wrapped_field_type_name._M_dataplus._M_p == &wrapped_field_type_name.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(wrapped_field_type_name.field_2._M_allocated_capacity._1_7_,
                        wrapped_field_type_name.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
               wrapped_field_type_name.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = wrapped_field_type_name._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(wrapped_field_type_name.field_2._M_allocated_capacity._1_7_,
                        wrapped_field_type_name.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = wrapped_field_type_name._M_string_length;
        wrapped_field_type_name._M_string_length = 0;
        wrapped_field_type_name.field_2._M_local_buf[0] = '\0';
        wrapped_field_type_name._M_dataplus._M_p = (pointer)&wrapped_field_type_name.field_2;
      }
      else {
        std::operator+(__return_storage_ptr__,&wrapped_field_type_name,"?");
      }
      std::__cxx11::string::~string((string *)&wrapped_field_type_name);
      return __return_storage_ptr__;
    }
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)this_00,descriptor_01);
    return __return_storage_ptr__;
  case TYPE_BYTES:
    __s = "pb::ByteString";
    break;
  case TYPE_ENUM:
    this_01 = FieldDescriptor::enum_type(descriptor);
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)this_01,descriptor_02);
    return __return_storage_ptr__;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&wrapped_field_type_name,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0xd1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&wrapped_field_type_name,"Unknown field type.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage((LogMessage *)&wrapped_field_type_name);
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&wrapped_field_type_name);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::type_name(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->enum_type());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field =
            descriptor->message_type()->field(0);
        string wrapped_field_type_name = type_name(wrapped_field);
        // String and ByteString go to the same type; other wrapped types
        // go to the nullable equivalent.
        if (wrapped_field->type() == FieldDescriptor::TYPE_STRING ||
            wrapped_field->type() == FieldDescriptor::TYPE_BYTES) {
          return wrapped_field_type_name;
        } else {
          return wrapped_field_type_name + "?";
        }
      }
      return GetClassName(descriptor->message_type());
    case FieldDescriptor::TYPE_DOUBLE:
      return "double";
    case FieldDescriptor::TYPE_FLOAT:
      return "float";
    case FieldDescriptor::TYPE_INT64:
      return "long";
    case FieldDescriptor::TYPE_UINT64:
      return "ulong";
    case FieldDescriptor::TYPE_INT32:
      return "int";
    case FieldDescriptor::TYPE_FIXED64:
      return "ulong";
    case FieldDescriptor::TYPE_FIXED32:
      return "uint";
    case FieldDescriptor::TYPE_BOOL:
      return "bool";
    case FieldDescriptor::TYPE_STRING:
      return "string";
    case FieldDescriptor::TYPE_BYTES:
      return "pb::ByteString";
    case FieldDescriptor::TYPE_UINT32:
      return "uint";
    case FieldDescriptor::TYPE_SFIXED32:
      return "int";
    case FieldDescriptor::TYPE_SFIXED64:
      return "long";
    case FieldDescriptor::TYPE_SINT32:
      return "int";
    case FieldDescriptor::TYPE_SINT64:
      return "long";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}